

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TransSetSyntax::setChild(TransSetSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  SyntaxNode *this_00;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *pSVar2;
  logic_error *this_01;
  Token TVar3;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 2) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->closeParen).kind = TVar3.kind;
    (this->closeParen).field_0x2 = TVar3._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->closeParen).rawLen = TVar3.rawLen;
    (this->closeParen).info = TVar3.info;
  }
  else if (index == 1) {
    this_00 = TokenOrSyntax::node(&child);
    pSVar2 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>>
                       (this_00);
    (this->ranges).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar2->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->ranges).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar2->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->ranges).super_SyntaxListBase.childCount = (pSVar2->super_SyntaxListBase).childCount;
    sVar1 = (pSVar2->elements).size_;
    (this->ranges).elements.data_ = (pSVar2->elements).data_;
    (this->ranges).elements.size_ = sVar1;
  }
  else {
    if (index != 0) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_98,&local_b8,":");
      std::__cxx11::to_string(&local_d8,0x32ae);
      std::operator+(&local_78,&local_98,&local_d8);
      std::operator+(&local_58,&local_78,": ");
      std::operator+(&local_38,&local_58,"Default case should be unreachable!");
      std::logic_error::logic_error(this_01,(string *)&local_38);
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->openParen).kind = TVar3.kind;
    (this->openParen).field_0x2 = TVar3._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->openParen).rawLen = TVar3.rawLen;
    (this->openParen).info = TVar3.info;
  }
  return;
}

Assistant:

void TransSetSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: ranges = child.node()->as<SeparatedSyntaxList<TransRangeSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}